

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ConvertLocalAccessChains
          (LocalAccessChainConvertPass *this,Function *func)

{
  pointer puVar1;
  IRContext *pIVar2;
  bool bVar3;
  uint32_t valId;
  Status SVar4;
  Instruction *pIVar5;
  byte bVar6;
  Status SVar7;
  long lVar8;
  uint uVar9;
  pointer puVar10;
  bool bVar11;
  Instruction *store;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  uint32_t varId_1;
  uint32_t varId;
  undefined1 local_98 [16];
  pointer local_88;
  iterator iStack_80;
  Instruction **local_78;
  uint32_t local_6c;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  Function *local_40;
  iterator local_38;
  
  FindTargetVars(this,func);
  puVar10 = (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = puVar10 ==
           (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar11) {
    SVar7 = SuccessWithoutChange;
  }
  else {
    SVar7 = Failure;
    local_40 = func;
    do {
      local_88 = (pointer)0x0;
      iStack_80._M_current = (Instruction **)0x0;
      local_78 = (Instruction **)0x0;
      for (local_98._0_8_ =
                *(Instruction **)
                 ((long)&(((puVar10->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
                         ->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
          (Instruction *)local_98._0_8_ !=
          (Instruction *)
          ((long)&(((puVar10->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_
                  ).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          local_98._0_8_ =
               ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_98._0_8_)->next_node_) {
        if (((Instruction *)local_98._0_8_)->opcode_ == OpStore) {
          local_98._8_8_ = local_98._0_8_;
          pIVar5 = MemPass::GetPtr(&this->super_MemPass,(Instruction *)local_98._0_8_,&local_6c);
          bVar3 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,pIVar5->opcode_);
          bVar6 = 8;
          if ((bVar3) && (bVar3 = MemPass::IsTargetVar(&this->super_MemPass,local_6c), bVar3)) {
            local_68._M_unused._M_object = (pointer *)0x0;
            local_68._8_8_ = 0;
            local_58 = (code *)0x0;
            uVar9 = (*(bool *)(local_98._8_8_ + 0x2d) & 1) + 1;
            if (*(bool *)(local_98._8_8_ + 0x2c) == false) {
              uVar9 = (uint)*(bool *)(local_98._8_8_ + 0x2d);
            }
            valId = Instruction::GetSingleWordOperand((Instruction *)local_98._8_8_,uVar9 + 1);
            bVar3 = GenAccessChainStoreReplacement
                              (this,pIVar5,valId,
                               (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                                *)&local_68);
            bVar6 = 1;
            if (bVar3) {
              lVar8 = local_68._8_8_ - local_68._0_8_;
              if (iStack_80._M_current == local_78) {
                std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                ::_M_realloc_insert<spvtools::opt::Instruction*const&>
                          ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                            *)&local_88,iStack_80,(Instruction **)(local_98 + 8));
              }
              else {
                *iStack_80._M_current = (Instruction *)local_98._8_8_;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
              lVar8 = lVar8 >> 3;
              local_98._0_8_ =
                   ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_98._0_8_)->next_node_;
              InstructionList::iterator::InsertBefore
                        (&local_38,
                         (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                          *)local_98);
              local_98._0_8_ = local_38.super_iterator.node_;
              while (lVar8 = lVar8 + -1, lVar8 != 0) {
                Instruction::UpdateDebugInfoFrom
                          ((Instruction *)local_98._0_8_,(Instruction *)local_98._8_8_);
                pIVar2 = (this->super_MemPass).super_Pass.context_;
                if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
                  IRContext::BuildDebugInfoManager(pIVar2);
                }
                analysis::DebugInfoManager::AnalyzeDebugInst
                          ((pIVar2->debug_info_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                           ._M_head_impl,(Instruction *)local_98._0_8_);
                local_98._0_8_ =
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_98._0_8_)->next_node_;
              }
              Instruction::UpdateDebugInfoFrom
                        ((Instruction *)local_98._0_8_,(Instruction *)local_98._8_8_);
              pIVar2 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
                IRContext::BuildDebugInfoManager(pIVar2);
              }
              analysis::DebugInfoManager::AnalyzeDebugInst
                        ((pIVar2->debug_info_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                         _M_head_impl,(Instruction *)local_98._0_8_);
              SVar7 = 1;
              bVar6 = 0;
            }
            std::
            vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                       *)&local_68);
          }
LAB_00242144:
          if ((bVar6 & 7) != 0) goto LAB_0024215e;
        }
        else if (((Instruction *)local_98._0_8_)->opcode_ == OpLoad) {
          pIVar5 = MemPass::GetPtr(&this->super_MemPass,(Instruction *)local_98._0_8_,
                                   (uint32_t *)local_68._M_pod_data);
          bVar3 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,pIVar5->opcode_);
          bVar6 = 8;
          if (bVar3) {
            bVar3 = MemPass::IsTargetVar(&this->super_MemPass,local_68._0_4_);
            if (bVar3) {
              bVar3 = ReplaceAccessChainLoad(this,pIVar5,(Instruction *)local_98._0_8_);
              bVar6 = !bVar3;
              if (bVar3) {
                SVar7 = 1;
              }
            }
          }
          goto LAB_00242144;
        }
      }
      bVar6 = 5;
LAB_0024215e:
      if (bVar6 == 5) {
        bVar6 = 0;
        while (local_88 != (pointer)iStack_80._M_current) {
          puVar1 = (pointer)(iStack_80._M_current + -1);
          iStack_80._M_current = iStack_80._M_current + -1;
          local_68._8_8_ = 0;
          local_68._M_unused._M_object = &local_88;
          pcStack_50 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:318:21)>
                       ::_M_invoke;
          local_58 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:318:21)>
                     ::_M_manager;
          MemPass::DCEInst(&this->super_MemPass,
                           (puVar1->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                           (function<void_(spvtools::opt::Instruction_*)> *)&local_68);
          if (local_58 != (code *)0x0) {
            (*local_58)(&local_68,&local_68,__destroy_functor);
          }
        }
      }
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      if (bVar6 != 0) break;
      puVar10 = puVar10 + 1;
      bVar11 = puVar10 ==
               (local_40->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar11);
    SVar7 = SVar7 ^ SuccessWithoutChange;
  }
  SVar4 = Failure;
  if (bVar11) {
    SVar4 = SVar7;
  }
  return SVar4;
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ConvertLocalAccessChains(
    Function* func) {
  FindTargetVars(func);
  // Replace access chains of all targeted variables with equivalent
  // extract and insert sequences
  bool modified = false;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    std::vector<Instruction*> dead_instructions;
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      switch (ii->opcode()) {
        case spv::Op::OpLoad: {
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          if (!ReplaceAccessChainLoad(ptrInst, &*ii)) {
            return Status::Failure;
          }
          modified = true;
        } break;
        case spv::Op::OpStore: {
          uint32_t varId;
          Instruction* store = &*ii;
          Instruction* ptrInst = GetPtr(store, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          std::vector<std::unique_ptr<Instruction>> newInsts;
          uint32_t valId = store->GetSingleWordInOperand(kStoreValIdInIdx);
          if (!GenAccessChainStoreReplacement(ptrInst, valId, &newInsts)) {
            return Status::Failure;
          }
          size_t num_of_instructions_to_skip = newInsts.size() - 1;
          dead_instructions.push_back(store);
          ++ii;
          ii = ii.InsertBefore(std::move(newInsts));
          for (size_t i = 0; i < num_of_instructions_to_skip; ++i) {
            ii->UpdateDebugInfoFrom(store);
            context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
            ++ii;
          }
          ii->UpdateDebugInfoFrom(store);
          context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
          modified = true;
        } break;
        default:
          break;
      }
    }

    while (!dead_instructions.empty()) {
      Instruction* inst = dead_instructions.back();
      dead_instructions.pop_back();
      DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
        auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                           other_inst);
        if (i != dead_instructions.end()) {
          dead_instructions.erase(i);
        }
      });
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}